

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O0

uint __thiscall
Lib::
BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
::bubbleUp(BinaryHeap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_*,_FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare>
           *this,uint index)

{
  Comparison CVar1;
  uint in_ESI;
  long in_RDI;
  uint nextIndex;
  uint local_18;
  uint local_14;
  
  local_18 = in_ESI >> 1;
  local_14 = in_ESI;
  while( true ) {
    if (local_18 == 0) {
      return 1;
    }
    CVar1 = FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator_Compare::compare
                      (*(Constraint_Generator **)(*(long *)(in_RDI + 0x10) + (ulong)local_14 * 8),
                       *(Constraint_Generator **)(*(long *)(in_RDI + 0x10) + (ulong)local_18 * 8));
    if (CVar1 != LESS) break;
    std::swap<FMB::FiniteModelBuilder::HackyDSAE::Constraint_Generator*>
              ((Constraint_Generator **)(*(long *)(in_RDI + 0x10) + (ulong)local_14 * 8),
               (Constraint_Generator **)(*(long *)(in_RDI + 0x10) + (ulong)local_18 * 8));
    local_14 = local_18;
    local_18 = local_18 >> 1;
  }
  return local_14;
}

Assistant:

unsigned bubbleUp(unsigned index)
  {
    ASS(index>0 && index<=_size);
    unsigned nextIndex=index>>1;
    while(nextIndex) {
      if(Comparator::compare(_data1[index], _data1[nextIndex])==LESS) {
	std::swap(_data1[index], _data1[nextIndex]);
      } else {
	return index;
      }
      index=nextIndex;
      nextIndex=index>>1;
    }
    return 1;
  }